

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_scalar_hist1x4(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint32_t high [256];
  uint32_t low [256];
  int local_828 [256];
  int local_428 [258];
  
  memset(local_428,0,0x400);
  memset(local_828,0,0x400);
  for (uVar6 = 0; uVar6 < (len & 0xfffffffc); uVar6 = uVar6 + 4) {
    uVar1 = data[uVar6];
    local_428[uVar1 & 0xff] = local_428[uVar1 & 0xff] + 1;
    local_828[uVar1 >> 8] = local_828[uVar1 >> 8] + 1;
    uVar1 = data[uVar6 + 1];
    local_428[uVar1 & 0xff] = local_428[uVar1 & 0xff] + 1;
    local_828[uVar1 >> 8] = local_828[uVar1 >> 8] + 1;
    uVar1 = data[uVar6 + 2];
    local_428[uVar1 & 0xff] = local_428[uVar1 & 0xff] + 1;
    local_828[uVar1 >> 8] = local_828[uVar1 >> 8] + 1;
    uVar1 = data[uVar6 + 3];
    local_428[uVar1 & 0xff] = local_428[uVar1 & 0xff] + 1;
    local_828[uVar1 >> 8] = local_828[uVar1 >> 8] + 1;
  }
  for (; uVar6 < len; uVar6 = uVar6 + 1) {
    local_428[(byte)data[uVar6]] = local_428[(byte)data[uVar6]] + 1;
    local_828[*(byte *)((long)data + uVar6 * 2 + 3)] =
         local_828[*(byte *)((long)data + uVar6 * 2 + 3)] + 1;
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    iVar2 = local_428[lVar3];
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      iVar5 = 0;
      if (((uint)lVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        iVar5 = iVar2;
      }
      flags[lVar4] = flags[lVar4] + iVar5;
    }
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    iVar2 = local_828[lVar3];
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      iVar5 = 0;
      if (((uint)lVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        iVar5 = iVar2;
      }
      flags[lVar4 + 8] = flags[lVar4 + 8] + iVar5;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_hist1x4(const uint16_t* data, uint32_t len, uint32_t* flags) {
     uint32_t low[256] = {0}, high[256] = {0};

     int i = 0;
     for (i = 0; i < (len & ~3); i+=4) {
          ++low[data[i+0] & 255];
          ++high[(data[i+0] >> 8) & 255];
          ++low[data[i+1] & 255];
          ++high[(data[i+1] >> 8) & 255];
          ++low[data[i+2] & 255];
          ++high[(data[i+2] >> 8) & 255];
          ++low[data[i+3] & 255];
          ++high[(data[i+3] >> 8) & 255];
     }
     while (i < len) {
          ++low[data[i] & 255];
          ++high[(data[++i] >> 8) & 255];
     }

     for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k] += ((i & (1 << k)) >> k) * low[i];
        }
    }

    for (int i = 0; i < 256; ++i) {
        for (int k = 0; k < 8; ++k) {
            flags[k+8] += ((i & (1 << k)) >> k) * high[i];
        }
    }

    return 0;
}